

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O0

void __thiscall
amrex::TagBoxArray::TagBoxArray(TagBoxArray *this,BoxArray *ba,DistributionMapping *dm,int _ngrow)

{
  undefined4 in_ECX;
  undefined8 *in_RDI;
  FabArray<amrex::TagBox> *this_00;
  value_type val;
  FabArray<amrex::TagBox> *this_01;
  undefined4 in_stack_ffffffffffffff90;
  undefined1 *puVar1;
  DistributionMapping *in_stack_ffffffffffffffa0;
  BoxArray *in_stack_ffffffffffffffa8;
  FabArray<amrex::TagBox> *this_02;
  undefined8 local_48;
  undefined8 factory;
  
  local_48 = 0;
  factory = (FabFactory<amrex::TagBox> *)0x0;
  puVar1 = (undefined1 *)&stack0xffffffffffffffb8;
  MFInfo::MFInfo((MFInfo *)0x10c1697);
  this_02 = (FabArray<amrex::TagBox> *)0x0;
  this_00 = (FabArray<amrex::TagBox> *)&stack0xffffffffffffffb0;
  DefaultFabFactory<amrex::TagBox>::DefaultFabFactory((DefaultFabFactory<amrex::TagBox> *)this_00);
  this_01 = this_00;
  FabArray<amrex::TagBox>::FabArray
            (this_02,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
             (int)((ulong)puVar1 >> 0x20),(int)puVar1,
             (MFInfo *)CONCAT44(in_ECX,in_stack_ffffffffffffff90),
             (FabFactory<amrex::TagBox> *)factory);
  val = (value_type)((ulong)this_00 >> 0x38);
  DefaultFabFactory<amrex::TagBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::TagBox> *)0x10c16e9);
  MFInfo::~MFInfo((MFInfo *)0x10c16f3);
  *in_RDI = &PTR__TagBoxArray_018037e8;
  FabArray<amrex::TagBox>::setVal<amrex::TagBox,_0>(this_01,val);
  return;
}

Assistant:

TagBoxArray::TagBoxArray (const BoxArray& ba,
                          const DistributionMapping& dm,
                          int             _ngrow)
    :
    FabArray<TagBox>(ba,dm,1,_ngrow,MFInfo(),DefaultFabFactory<TagBox>())
{
    setVal(TagBox::CLEAR);
}